

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O1

void __thiscall VariableAndMod::VariableAndMod(VariableAndMod *this,string *name,string *mods)

{
  pointer pcVar1;
  
  (this->variable_name)._M_dataplus._M_p = (pointer)&(this->variable_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->modifiers)._M_dataplus._M_p = (pointer)&(this->modifiers).field_2;
  pcVar1 = (mods->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->modifiers,pcVar1,pcVar1 + mods->_M_string_length);
  return;
}

Assistant:

VariableAndMod(string name, string mods)
      : variable_name(name), modifiers(mods) { }